

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O2

void read_chunk(file *file)

{
  png_uint_32 pVar1;
  uint uVar2;
  int iVar3;
  png_uint_32 pVar4;
  uint uVar5;
  char *what;
  uint uVar6;
  uint offset;
  ulong uVar7;
  png_uint_32 file_crc;
  png_uint_32 next_length;
  png_uint_32 local_40;
  png_uint_32 local_3c;
  png_uint_32 local_38;
  png_uint_32 next_type;
  
  pVar4 = file->type;
  if (pVar4 == 0) {
    what = "read beyond IEND";
    iVar3 = 7;
  }
  else {
    uVar2 = file->length;
    uVar7 = (ulong)uVar2;
    if (0x40 < (*(ushort *)file->global & 0xe0)) {
      fputs("   ",_stderr);
      type_name(pVar4,(FILE *)_stderr);
      fprintf(_stderr," %lu\n",uVar7);
    }
    pVar1 = crc_init_4(pVar4);
    file->crc = pVar1;
    if (uVar2 != 0) {
      do {
        uVar2 = read_byte(file);
        if (uVar2 == 0xffffffff) goto LAB_00103d22;
        pVar1 = pVar1 >> 8 ^ crc_table[(uVar2 ^ pVar1) & 0xff];
        uVar2 = (int)uVar7 - 1;
        uVar7 = (ulong)uVar2;
      } while (uVar2 != 0);
      file->crc = pVar1;
    }
    uVar2 = read_4(file,&file_crc);
    if (uVar2 == 4) {
      if (pVar4 == 0x49454e44) {
LAB_00103e6f:
        uVar2 = file_crc;
        pVar4 = 0;
        pVar1 = 0;
LAB_00103e88:
        process_chunk(file,uVar2,pVar4,pVar1);
        return;
      }
      uVar2 = read_4(file,&next_length);
      pVar4 = next_length;
      if (((-1 < (int)next_length && uVar2 == 4) && (uVar2 = read_4(file,&next_type), uVar2 == 4))
         && (iVar3 = chunk_type_valid(next_type), iVar3 != 0)) {
        file->read_count = file->read_count - 8;
        uVar2 = file_crc;
        pVar1 = next_type;
        goto LAB_00103e88;
      }
    }
LAB_00103d22:
    *(byte *)&file->status_code = (byte)file->status_code | 4;
    if ((undefined1  [96])((undefined1  [96])*file->global & (undefined1  [96])0xe0) !=
        (undefined1  [96])0x0) {
      fputs(" SYNC ",_stderr);
      type_name(file->type,(FILE *)_stderr);
      putc(10,_stderr);
    }
    file_setpos(file,&file->data_pos);
    file->read_count = 8;
    uVar2 = read_4(file,&next_length);
    if (uVar2 == 4) {
      local_3c = file->type;
      pVar4 = crc_init_4(local_3c);
      uVar6 = 0;
      offset = 0;
      local_38 = 0;
      uVar2 = next_length;
      do {
        if ((uVar2 ^ pVar4) == 0xffffffff) {
          if (local_3c == 0x49454e44) {
            file->length = local_38;
            file_crc = uVar2;
            goto LAB_00103e6f;
          }
          for (; uVar6 < offset + 8; uVar6 = uVar6 + 1) {
            iVar3 = read_byte(file);
            if (iVar3 == -1) goto LAB_00103f09;
            *(char *)((long)&file_crc + (ulong)(uVar6 & 7)) = (char)iVar3;
          }
          uVar6 = uVar6 - (offset & 0xfffffff8);
          offset = offset & 7;
          pVar1 = get32((png_bytep)&file_crc,offset);
          if (pVar1 < 0x7fffffff) {
            local_40 = pVar1;
            pVar1 = get32((png_bytep)&file_crc,offset + 4);
            iVar3 = chunk_type_valid(pVar1);
            if (iVar3 != 0) {
              file->read_count = file->read_count - 8;
              pVar4 = local_40;
              goto LAB_00103e88;
            }
          }
        }
        if (offset < uVar6) {
          offset = offset + 1;
          uVar5 = (uint)*(byte *)((long)&file_crc + (ulong)(offset & 7));
        }
        else {
          uVar5 = read_byte(file);
          if (uVar5 == 0xffffffff) break;
        }
        pVar4 = pVar4 >> 8 ^ crc_table[pVar4 & 0xff ^ uVar2 >> 0x18];
        uVar2 = uVar2 * 0x100 + uVar5;
        local_38 = local_38 + 1;
      } while( true );
    }
LAB_00103f09:
    what = "damaged PNG stream";
    iVar3 = 5;
  }
  stop(file,iVar3,what);
}

Assistant:

static void
read_chunk(struct file *file)
   /* On entry file::data_pos must be set to the position of the first byte
    * of the chunk data *and* the input file must be at this position.  This
    * routine (via process_chunk) instantiates a chunk or IDAT control structure
    * based on file::length and file::type and also resets these fields and
    * file::data_pos for the chunk after this one.  For an IDAT chunk the whole
    * stream of IDATs will be read, until something other than an IDAT is
    * encountered, and the file fields will be set for the chunk after the end
    * of the stream of IDATs.
    *
    * For IEND the file::type field will be set to 0, and nothing beyond the end
    * of the IEND chunk will have been read.
    */
{
   png_uint_32 length = file->length;
   png_uint_32 type = file->type;

   /* After IEND file::type is set to 0, if libpng attempts to read
    * more data at this point this is a bug in libpng.
    */
   if (type == 0)
      stop(file, UNEXPECTED_ERROR_CODE, "read beyond IEND");

   if (file->global->verbose > 2)
   {
      fputs("   ", stderr);
      type_name(type, stderr);
      fprintf(stderr, " %lu\n", (unsigned long)length);
   }

   /* Start the read_crc calculation with the chunk type, then read to the end
    * of the chunk data (without processing it in any way) to check that it is
    * all there and calculate the CRC.
    */
   file->crc = crc_init_4(type);
   if (crc_read_many(file, length)) /* else it was truncated */
   {
      png_uint_32 file_crc; /* CRC read from file */
      unsigned int nread = read_4(file, &file_crc);

      if (nread == 4)
      {
         if (type != png_IEND) /* do not read beyond IEND */
         {
            png_uint_32 next_length;

            nread += read_4(file, &next_length);
            if (nread == 8 && next_length <= 0x7fffffff)
            {
               png_uint_32 next_type;

               nread += read_4(file, &next_type);

               if (nread == 12 && chunk_type_valid(next_type))
               {
                  /* Adjust the read count back to the correct value for this
                   * chunk.
                   */
                  file->read_count -= 8;
                  process_chunk(file, file_crc, next_length, next_type);
                  return;
               }
            }
         }

         else /* IEND */
         {
            process_chunk(file, file_crc, 0, 0);
            return;
         }
      }
   }

   /* Control gets to here if the stream seems invalid or damaged in some
    * way.  Either there was a problem reading all the expected data (this
    * chunk's data, its CRC and the length and type of the next chunk) or the
    * next chunk length/type are invalid.  Notice that the cases that end up
    * here all correspond to cases that would otherwise terminate the read of
    * the PNG file.
    */
   sync_stream(file);
}